

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O3

size_t duckdb_zstd::HUF_DecompressFastArgs_init
                 (HUF_DecompressFastArgs *args,void *dst,size_t dstSize,void *src,size_t srcSize,
                 HUF_DTable *DTable)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  size_t sVar7;
  BYTE *pBVar8;
  byte bVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  
  sVar7 = 0;
  sVar10 = 0;
  if (0 < (long)dstSize) {
    sVar10 = dstSize;
  }
  if ((dstSize != 0) && (sVar7 = 0xffffffffffffffec, 9 < srcSize)) {
    if ((*DTable & 0xff0000) == 0xb0000) {
      uVar11 = (ulong)*src;
      uVar4 = *(ushort *)((long)src + 2);
      uVar5 = *(ushort *)((long)src + 4);
      pBVar8 = (BYTE *)((long)src + uVar11 + 6);
      pBVar1 = pBVar8 + uVar4;
      pBVar2 = pBVar1 + uVar5;
      sVar7 = 0;
      args->iend[0] = (BYTE *)((long)src + 6);
      args->iend[1] = pBVar8;
      args->iend[2] = pBVar1;
      args->iend[3] = pBVar2;
      if ((((7 < uVar11) && (7 < uVar4)) && (7 < uVar5)) &&
         ((uVar12 = uVar11 + uVar4 + (ulong)uVar5 + 6, 7 < srcSize - uVar12 &&
          (sVar7 = 0xffffffffffffffec, uVar12 <= srcSize)))) {
        args->ip[0] = (BYTE *)((long)src + (uVar11 - 2));
        args->ip[1] = pBVar1 + -8;
        args->ip[2] = pBVar2 + -8;
        args->ip[3] = (BYTE *)((long)src + (srcSize - 8));
        args->op[0] = (BYTE *)dst;
        uVar12 = dstSize + 3 >> 2;
        args->op[1] = (BYTE *)((long)dst + uVar12);
        pBVar8 = (BYTE *)((long)dst + uVar12) + uVar12;
        args->op[2] = pBVar8;
        args->op[3] = pBVar8 + uVar12;
        if (pBVar8 + uVar12 < (BYTE *)(sVar10 + (long)dst)) {
          bVar3 = *(byte *)((long)src + uVar11 + 5);
          iVar6 = 0x1f;
          if (bVar3 != 0) {
            for (; bVar3 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          bVar9 = ~(byte)iVar6 + 9;
          if (bVar3 == 0) {
            bVar9 = 0;
          }
          args->bits[0] = (*(ulong *)((long)src + (uVar11 - 2)) | 1) << (bVar9 & 0x3f);
          bVar3 = pBVar1[-1];
          iVar6 = 0x1f;
          if (bVar3 != 0) {
            for (; bVar3 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          bVar9 = ~(byte)iVar6 + 9;
          if (bVar3 == 0) {
            bVar9 = 0;
          }
          args->bits[1] = (*(ulong *)(pBVar1 + -8) | 1) << (bVar9 & 0x3f);
          bVar3 = pBVar2[-1];
          iVar6 = 0x1f;
          if (bVar3 != 0) {
            for (; bVar3 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          bVar9 = ~(byte)iVar6 + 9;
          if (bVar3 == 0) {
            bVar9 = 0;
          }
          args->bits[2] = (*(ulong *)(pBVar2 + -8) | 1) << (bVar9 & 0x3f);
          bVar3 = *(byte *)((long)src + (srcSize - 1));
          iVar6 = 0x1f;
          if (bVar3 != 0) {
            for (; bVar3 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          bVar9 = ~(byte)iVar6 + 9;
          if (bVar3 == 0) {
            bVar9 = 0;
          }
          args->bits[3] = (*(ulong *)((long)src + (srcSize - 8)) | 1) << (bVar9 & 0x3f);
          args->ilowest = (BYTE *)src;
          args->oend = (BYTE *)(sVar10 + (long)dst);
          args->dt = DTable + 1;
          sVar7 = 1;
        }
        else {
          sVar7 = 0;
        }
      }
      return sVar7;
    }
    sVar7 = 0;
  }
  return sVar7;
}

Assistant:

static size_t HUF_DecompressFastArgs_init(HUF_DecompressFastArgs* args, void* dst, size_t dstSize, void const* src, size_t srcSize, const HUF_DTable* DTable)
{
    void const* dt = DTable + 1;
    U32 const dtLog = HUF_getDTableDesc(DTable).tableLog;

    const BYTE* const istart = (const BYTE*)src;

    BYTE* const oend = ZSTD_maybeNullPtrAdd((BYTE*)dst, dstSize);

    /* The fast decoding loop assumes 64-bit little-endian.
     * This condition is false on x32.
     */
    if (!MEM_isLittleEndian() || MEM_32bits())
        return 0;

    /* Avoid nullptr addition */
    if (dstSize == 0)
        return 0;
    assert(dst != NULL);

    /* strict minimum : jump table + 1 byte per stream */
    if (srcSize < 10)
        return ERROR(corruption_detected);

    /* Must have at least 8 bytes per stream because we don't handle initializing smaller bit containers.
     * If table log is not correct at this point, fallback to the old decoder.
     * On small inputs we don't have enough data to trigger the fast loop, so use the old decoder.
     */
    if (dtLog != HUF_DECODER_FAST_TABLELOG)
        return 0;

    /* Read the jump table. */
    {
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = srcSize - (length1 + length2 + length3 + 6);
        args->iend[0] = istart + 6;  /* jumpTable */
        args->iend[1] = args->iend[0] + length1;
        args->iend[2] = args->iend[1] + length2;
        args->iend[3] = args->iend[2] + length3;

        /* HUF_initFastDStream() requires this, and this small of an input
         * won't benefit from the ASM loop anyways.
         */
        if (length1 < 8 || length2 < 8 || length3 < 8 || length4 < 8)
            return 0;
        if (length4 > srcSize) return ERROR(corruption_detected);   /* overflow */
    }
    /* ip[] contains the position that is currently loaded into bits[]. */
    args->ip[0] = args->iend[1] - sizeof(U64);
    args->ip[1] = args->iend[2] - sizeof(U64);
    args->ip[2] = args->iend[3] - sizeof(U64);
    args->ip[3] = (BYTE const*)src + srcSize - sizeof(U64);

    /* op[] contains the output pointers. */
    args->op[0] = (BYTE*)dst;
    args->op[1] = args->op[0] + (dstSize+3)/4;
    args->op[2] = args->op[1] + (dstSize+3)/4;
    args->op[3] = args->op[2] + (dstSize+3)/4;

    /* No point to call the ASM loop for tiny outputs. */
    if (args->op[3] >= oend)
        return 0;

    /* bits[] is the bit container.
        * It is read from the MSB down to the LSB.
        * It is shifted left as it is read, and zeros are
        * shifted in. After the lowest valid bit a 1 is
        * set, so that CountTrailingZeros(bits[]) can be used
        * to count how many bits we've consumed.
        */
    args->bits[0] = HUF_initFastDStream(args->ip[0]);
    args->bits[1] = HUF_initFastDStream(args->ip[1]);
    args->bits[2] = HUF_initFastDStream(args->ip[2]);
    args->bits[3] = HUF_initFastDStream(args->ip[3]);

    /* The decoders must be sure to never read beyond ilowest.
     * This is lower than iend[0], but allowing decoders to read
     * down to ilowest can allow an extra iteration or two in the
     * fast loop.
     */
    args->ilowest = istart;

    args->oend = oend;
    args->dt = dt;

    return 1;
}